

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall HighsCliqueTable::resolveSubstitution(HighsCliqueTable *this,CliqueVar *v)

{
  const_reference pvVar1;
  const_reference pvVar2;
  CliqueVar *in_RSI;
  long in_RDI;
  Substitution subst;
  CliqueVar *in_stack_ffffffffffffffc8;
  undefined4 local_1c;
  undefined4 uStack_14;
  
  while( true ) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),
                        (ulong)((uint)*in_RSI & 0x7fffffff));
    if (*pvVar1 == 0) break;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),
                        (ulong)((uint)*in_RSI & 0x7fffffff));
    pvVar2 = std::
             vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
             ::operator[]((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                           *)(in_RDI + 0x118),(long)(*pvVar1 + -1));
    if ((int)*in_RSI < 0) {
      uStack_14 = (*pvVar2).replace;
      local_1c = uStack_14;
    }
    else {
      local_1c = CliqueVar::complement(in_stack_ffffffffffffffc8);
    }
    *in_RSI = local_1c;
  }
  return;
}

Assistant:

void HighsCliqueTable::resolveSubstitution(CliqueVar& v) const {
  while (colsubstituted[v.col]) {
    Substitution subst = substitutions[colsubstituted[v.col] - 1];
    v = v.val == 1 ? subst.replace : subst.replace.complement();
  }
}